

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_enc_utils.c
# Opt level: O0

RK_S32 mpi_enc_opt_fps(void *ctx,char *next)

{
  uint uVar1;
  bool local_39;
  RK_U32 num;
  MpiEncTestArgs *cmd;
  char *next_local;
  void *ctx_local;
  
  if (next == (char *)0x0) {
    _mpp_log_l(2,"mpi_enc_utils","invalid output frame rate\n",0);
    ctx_local._4_4_ = 0;
  }
  else {
    uVar1 = __isoc99_sscanf(next,"%d:%d:%d/%d:%d:%d",(long)ctx + 0x5c,(long)ctx + 0x60,
                            (long)ctx + 0x58,(long)ctx + 0x68,(long)ctx + 0x6c,(long)ctx + 100);
    if (uVar1 - 1 < 5 || uVar1 == 6) {
      switch((long)&switchD_0010e2e3::switchdataD_00119154 +
             (long)(int)(&switchD_0010e2e3::switchdataD_00119154)[uVar1 - 1]) {
      case 0x10e2e5:
        *(undefined4 *)((long)ctx + 0x68) = *(undefined4 *)((long)ctx + 0x5c);
        *(undefined4 *)((long)ctx + 0x60) = 1;
        *(undefined4 *)((long)ctx + 0x6c) = 1;
        *(undefined4 *)((long)ctx + 0x58) = 0;
        *(undefined4 *)((long)ctx + 100) = 0;
        break;
      case 0x10e324:
        *(undefined4 *)((long)ctx + 0x68) = *(undefined4 *)((long)ctx + 0x5c);
        *(undefined4 *)((long)ctx + 0x6c) = *(undefined4 *)((long)ctx + 0x60);
        *(undefined4 *)((long)ctx + 0x58) = 0;
        *(undefined4 *)((long)ctx + 100) = 0;
        break;
      case 0x10e358:
        *(undefined4 *)((long)ctx + 0x68) = *(undefined4 *)((long)ctx + 0x5c);
        *(undefined4 *)((long)ctx + 0x6c) = *(undefined4 *)((long)ctx + 0x60);
        *(undefined4 *)((long)ctx + 100) = *(undefined4 *)((long)ctx + 0x58);
        break;
      case 0x10e384:
        *(undefined4 *)((long)ctx + 0x6c) = 1;
        *(undefined4 *)((long)ctx + 100) = 0;
        break;
      case 0x10e39c:
        *(undefined4 *)((long)ctx + 100) = 0;
        break;
      case 0x10e3a9:
      }
    }
    else {
      _mpp_log_l(2,"mpi_enc_utils",
                 "invalid in/out frame rate, use \"-fps numerator:denominator:flex\" for set the input to the same fps as the output, such as 50:1:1\n or \"-fps numerator:denominator:flex/numerator:denominator:flex\" for set input and output separately, such as 40:1:1/30:1:0\n"
                 ,0);
    }
    local_39 = uVar1 != 0 && uVar1 < 7;
    ctx_local._4_4_ = (uint)local_39;
  }
  return ctx_local._4_4_;
}

Assistant:

RK_S32 mpi_enc_opt_fps(void *ctx, const char *next)
{
    MpiEncTestArgs *cmd = (MpiEncTestArgs *)ctx;

    if (next) {
        RK_U32 num = sscanf(next, "%d:%d:%d/%d:%d:%d",
                            &cmd->fps_in_num, &cmd->fps_in_den, &cmd->fps_in_flex,
                            &cmd->fps_out_num, &cmd->fps_out_den, &cmd->fps_out_flex);
        switch (num) {
        case 1 : {
            cmd->fps_out_num = cmd->fps_in_num;
            cmd->fps_out_den = cmd->fps_in_den = 1;
            cmd->fps_out_flex = cmd->fps_in_flex = 0;
        } break;
        case 2 : {
            cmd->fps_out_num = cmd->fps_in_num;
            cmd->fps_out_den = cmd->fps_in_den;
            cmd->fps_out_flex = cmd->fps_in_flex = 0;
        } break;
        case 3 : {
            cmd->fps_out_num = cmd->fps_in_num;
            cmd->fps_out_den = cmd->fps_in_den;
            cmd->fps_out_flex = cmd->fps_in_flex;
        } break;
        case 4 : {
            cmd->fps_out_den = 1;
            cmd->fps_out_flex = 0;
        } break;
        case 5 : {
            cmd->fps_out_flex = 0;
        } break;
        case 6 : {
        } break;
        default : {
            mpp_err("invalid in/out frame rate,"
                    " use \"-fps numerator:denominator:flex\""
                    " for set the input to the same fps as the output, such as 50:1:1\n"
                    " or \"-fps numerator:denominator:flex/numerator:denominator:flex\""
                    " for set input and output separately, such as 40:1:1/30:1:0\n");
        } break;
        }

        return (num && num <= 6);
    }

    mpp_err("invalid output frame rate\n");
    return 0;
}